

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSleepCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestSleepCommand::Clone(cmCTestSleepCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *pcVar2;
  
  pcVar2 = (cmCommand *)operator_new(0x40);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00780808;
  pcVar1 = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  pcVar2[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  pcVar2[1].Makefile = pcVar1;
  return pcVar2;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestSleepCommand* ni = new cmCTestSleepCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }